

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O3

void dctInverse8x8_sse2_6(float *data)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fStack_88;
  float fStack_84;
  __m128 in [8];
  
  fVar26 = data[1];
  fVar16 = data[2];
  fVar8 = data[3];
  fVar23 = data[4];
  fVar9 = data[5];
  fVar24 = data[6];
  fVar10 = data[7];
  fVar11 = data[9];
  fVar17 = data[10];
  fVar18 = data[0xb];
  fVar19 = data[0xc];
  fVar20 = data[0xd];
  fVar21 = data[0xe];
  fVar22 = data[0xf];
  fVar12 = *data * 0.3535536 + 0.0;
  fVar13 = fVar12 + fVar16 * 0.4619398 + fVar23 * 0.3535536 + fVar24 * 0.1913422;
  fVar14 = fVar12 + fVar16 * 0.1913422 + fVar23 * -0.3535536 + fVar24 * -0.4619398;
  fVar15 = fVar12 + fVar16 * -0.1913422 + fVar23 * -0.3535536 + fVar24 * 0.4619398;
  fVar16 = fVar12 + fVar16 * -0.4619398 + fVar23 * 0.3535536 + fVar24 * -0.1913422;
  fVar23 = fVar26 * 0.4903927 + 0.0 + fVar8 * 0.4157349 + fVar9 * 0.2777855 + fVar10 * 0.09754573;
  fVar24 = fVar26 * 0.4157349 + 0.0 + fVar8 * -0.09754573 + fVar9 * -0.4903927 + fVar10 * -0.2777855
  ;
  fVar12 = fVar26 * 0.2777855 + 0.0 + fVar8 * -0.4903927 + fVar9 * 0.09754573 + fVar10 * 0.4157349;
  fVar26 = fVar26 * 0.09754573 + 0.0 + fVar8 * -0.2777855 + fVar9 * 0.4157349 + fVar10 * -0.4903927;
  *data = fVar13 + fVar23;
  data[1] = fVar14 + fVar24;
  data[2] = fVar15 + fVar12;
  data[3] = fVar16 + fVar26;
  data[4] = fVar16 - fVar26;
  data[5] = fVar15 - fVar12;
  data[6] = fVar14 - fVar24;
  data[7] = fVar13 - fVar23;
  fVar26 = data[8] * 0.3535536 + 0.0;
  fVar16 = fVar26 + fVar17 * 0.4619398 + fVar19 * 0.3535536 + fVar21 * 0.1913422;
  fVar8 = fVar26 + fVar17 * 0.1913422 + fVar19 * -0.3535536 + fVar21 * -0.4619398;
  fVar23 = fVar26 + fVar17 * -0.1913422 + fVar19 * -0.3535536 + fVar21 * 0.4619398;
  fVar26 = fVar26 + fVar17 * -0.4619398 + fVar19 * 0.3535536 + fVar21 * -0.1913422;
  fVar9 = fVar11 * 0.4903927 + 0.0 + fVar18 * 0.4157349 + fVar20 * 0.2777855 + fVar22 * 0.09754573;
  fVar24 = fVar11 * 0.4157349 + 0.0 + fVar18 * -0.09754573 + fVar20 * -0.4903927 +
           fVar22 * -0.2777855;
  fVar10 = fVar11 * 0.2777855 + 0.0 + fVar18 * -0.4903927 + fVar20 * 0.09754573 + fVar22 * 0.4157349
  ;
  fVar11 = fVar11 * 0.09754573 + 0.0 + fVar18 * -0.2777855 + fVar20 * 0.4157349 +
           fVar22 * -0.4903927;
  data[8] = fVar16 + fVar9;
  data[9] = fVar8 + fVar24;
  data[10] = fVar23 + fVar10;
  data[0xb] = fVar26 + fVar11;
  data[0xc] = fVar26 - fVar11;
  data[0xd] = fVar23 - fVar10;
  data[0xe] = fVar8 - fVar24;
  data[0xf] = fVar16 - fVar9;
  lVar6 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    pfVar1 = data + lVar6 * 4;
    lVar7 = 0;
    do {
      puVar2 = (undefined8 *)((long)pfVar1 + lVar7 * 2);
      uVar3 = puVar2[1];
      *(undefined8 *)((long)in[-1] + lVar7 + 8) = *puVar2;
      *(undefined8 *)((long)in[0] + lVar7) = uVar3;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x80);
    fVar21 = in[1][2] * 0.1913422 - in[5][2] * 0.4619398;
    fVar22 = in[1][3] * 0.1913422 - in[5][3] * 0.4619398;
    fVar12 = in[2][0] * 0.1913422 - in[6][0] * 0.4619398;
    fVar13 = in[2][1] * 0.1913422 - in[6][1] * 0.4619398;
    fVar14 = in[5][2] * 0.1913422 + in[1][2] * 0.4619398;
    fVar15 = in[5][3] * 0.1913422 + in[1][3] * 0.4619398;
    fVar25 = in[6][0] * 0.1913422 + in[2][0] * 0.4619398;
    fVar27 = in[6][1] * 0.1913422 + in[2][1] * 0.4619398;
    fVar26 = in[6][2] * 0.09754573 + in[4][2] * 0.2777855 +
             in[2][2] * 0.4157349 + in[0][2] * 0.4903927;
    fVar16 = in[6][3] * 0.09754573 + in[4][3] * 0.2777855 +
             in[2][3] * 0.4157349 + in[0][3] * 0.4903927;
    fVar8 = in[7][0] * 0.09754573 + in[5][0] * 0.2777855 +
            in[3][0] * 0.4157349 + in[1][0] * 0.4903927;
    fVar23 = in[7][1] * 0.09754573 + in[5][1] * 0.2777855 +
             in[3][1] * 0.4157349 + in[1][1] * 0.4903927;
    fVar32 = (in[0][2] * 0.4157349 - in[2][2] * 0.09754573) -
             (in[6][2] * 0.2777855 + in[4][2] * 0.4903927);
    fVar33 = (in[0][3] * 0.4157349 - in[2][3] * 0.09754573) -
             (in[6][3] * 0.2777855 + in[4][3] * 0.4903927);
    fVar34 = (in[1][0] * 0.4157349 - in[3][0] * 0.09754573) -
             (in[7][0] * 0.2777855 + in[5][0] * 0.4903927);
    fVar35 = (in[1][1] * 0.4157349 - in[3][1] * 0.09754573) -
             (in[7][1] * 0.2777855 + in[5][1] * 0.4903927);
    fVar40 = in[6][2] * 0.4157349 + in[4][2] * 0.09754573 +
             (in[0][2] * 0.2777855 - in[2][2] * 0.4903927);
    fVar41 = in[6][3] * 0.4157349 + in[4][3] * 0.09754573 +
             (in[0][3] * 0.2777855 - in[2][3] * 0.4903927);
    fVar42 = in[7][0] * 0.4157349 + in[5][0] * 0.09754573 +
             (in[1][0] * 0.2777855 - in[3][0] * 0.4903927);
    fVar43 = in[7][1] * 0.4157349 + in[5][1] * 0.09754573 +
             (in[1][1] * 0.2777855 - in[3][1] * 0.4903927);
    fVar9 = (in[4][2] * 0.4157349 - in[6][2] * 0.4903927) +
            (in[0][2] * 0.09754573 - in[2][2] * 0.2777855);
    fVar24 = (in[4][3] * 0.4157349 - in[6][3] * 0.4903927) +
             (in[0][3] * 0.09754573 - in[2][3] * 0.2777855);
    fVar10 = (in[5][0] * 0.4157349 - in[7][0] * 0.4903927) +
             (in[1][0] * 0.09754573 - in[3][0] * 0.2777855);
    fVar11 = (in[5][1] * 0.4157349 - in[7][1] * 0.4903927) +
             (in[1][1] * 0.09754573 - in[3][1] * 0.2777855);
    fVar28 = (fStack_88 + in[3][2]) * 0.3535536;
    fVar29 = (fStack_84 + in[3][3]) * 0.3535536;
    fVar30 = (in[0][0] + in[4][0]) * 0.3535536;
    fVar31 = (in[0][1] + in[4][1]) * 0.3535536;
    fVar36 = (fStack_88 - in[3][2]) * 0.3535536;
    fVar37 = (fStack_84 - in[3][3]) * 0.3535536;
    fVar38 = (in[0][0] - in[4][0]) * 0.3535536;
    fVar39 = (in[0][1] - in[4][1]) * 0.3535536;
    fVar17 = fVar21 + fVar36;
    fVar18 = fVar22 + fVar37;
    fVar19 = fVar12 + fVar38;
    fVar20 = fVar13 + fVar39;
    fVar36 = fVar36 - fVar21;
    fVar37 = fVar37 - fVar22;
    fVar38 = fVar38 - fVar12;
    fVar39 = fVar39 - fVar13;
    fVar21 = fVar14 + fVar28;
    fVar22 = fVar15 + fVar29;
    fVar12 = fVar25 + fVar30;
    fVar13 = fVar27 + fVar31;
    fVar28 = fVar28 - fVar14;
    fVar29 = fVar29 - fVar15;
    fVar30 = fVar30 - fVar25;
    fVar31 = fVar31 - fVar27;
    *pfVar1 = fVar26 + fVar21;
    pfVar1[1] = fVar16 + fVar22;
    pfVar1[2] = fVar8 + fVar12;
    pfVar1[3] = fVar23 + fVar13;
    pfVar1 = data + lVar6 * 4 + 8;
    *pfVar1 = fVar32 + fVar17;
    pfVar1[1] = fVar33 + fVar18;
    pfVar1[2] = fVar34 + fVar19;
    pfVar1[3] = fVar35 + fVar20;
    pfVar1 = data + lVar6 * 4 + 0x10;
    *pfVar1 = fVar40 + fVar36;
    pfVar1[1] = fVar41 + fVar37;
    pfVar1[2] = fVar42 + fVar38;
    pfVar1[3] = fVar43 + fVar39;
    pfVar1 = data + lVar6 * 4 + 0x18;
    *pfVar1 = fVar9 + fVar28;
    pfVar1[1] = fVar24 + fVar29;
    pfVar1[2] = fVar10 + fVar30;
    pfVar1[3] = fVar11 + fVar31;
    pfVar1 = data + lVar6 * 4 + 0x20;
    *pfVar1 = fVar28 - fVar9;
    pfVar1[1] = fVar29 - fVar24;
    pfVar1[2] = fVar30 - fVar10;
    pfVar1[3] = fVar31 - fVar11;
    pfVar1 = data + lVar6 * 4 + 0x28;
    *pfVar1 = fVar36 - fVar40;
    pfVar1[1] = fVar37 - fVar41;
    pfVar1[2] = fVar38 - fVar42;
    pfVar1[3] = fVar39 - fVar43;
    pfVar1 = data + lVar6 * 4 + 0x30;
    *pfVar1 = fVar17 - fVar32;
    pfVar1[1] = fVar18 - fVar33;
    pfVar1[2] = fVar19 - fVar34;
    pfVar1[3] = fVar20 - fVar35;
    pfVar1 = data + lVar6 * 4 + 0x38;
    *pfVar1 = fVar21 - fVar26;
    pfVar1[1] = fVar22 - fVar16;
    pfVar1[2] = fVar12 - fVar8;
    pfVar1[3] = fVar13 - fVar23;
    lVar6 = 1;
    bVar4 = false;
  } while (bVar5);
  return;
}

Assistant:

static void
dctInverse8x8_sse2_6 (float* data)
{
    dctInverse8x8_sse2 (data, 6);
}